

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmCopyFileIfDifferent(char *name1,char *name2)

{
  char *__s;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *name2_local;
  char *name1_local;
  
  local_18 = name2;
  name2_local = name1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name1,&local_39);
  __s = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_71);
  cmsys::SystemTools::CopyFileIfDifferent(&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void CCONV cmCopyFileIfDifferent(const char* name1, const char* name2)
{
  cmSystemTools::CopyFileIfDifferent(name1, name2);
}